

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall inja::Parser::parse_into(Parser *this,Template *tmpl,path *path)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  BlockNode *pBVar1;
  bool bVar2;
  long lVar3;
  const_pointer pvVar4;
  element_type *peVar5;
  string_view *this_00;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long local_248;
  undefined1 local_240 [8];
  shared_ptr<inja::ExpressionListNode> expression_list_node;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  size_type local_b0;
  unsigned_long local_a8;
  shared_ptr<inja::TextNode> local_a0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string_view local_30;
  path *local_20;
  path *path_local;
  Template *tmpl_local;
  Parser *this_local;
  
  local_20 = path;
  path_local = (path *)tmpl;
  tmpl_local = (Template *)this;
  local_30 = (string_view)
             ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&tmpl->content);
  Lexer::start(&this->lexer,local_30);
  this->current_block = (BlockNode *)path_local;
  do {
    get_next_token(this);
    switch((this->tok).kind) {
    case Text:
      pBVar1 = this->current_block;
      this_00 = &(this->tok).text;
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(this_00);
      lVar3 = ::std::__cxx11::string::c_str();
      local_a8 = (long)pvVar4 - lVar3;
      local_b0 = std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
      ::std::make_shared<inja::TextNode,long,unsigned_long>((long *)&local_a0,&local_a8);
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::TextNode>>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&pBVar1->nodes,&local_a0);
      std::shared_ptr<inja::TextNode>::~shared_ptr(&local_a0);
      break;
    case ExpressionOpen:
      get_next_token(this);
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&(this->tok).text);
      local_248 = ::std::__cxx11::string::c_str();
      local_248 = (long)pvVar4 - local_248;
      ::std::make_shared<inja::ExpressionListNode,long>((long *)local_240);
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::ExpressionListNode>&>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&this->current_block->nodes,(shared_ptr<inja::ExpressionListNode> *)local_240);
      peVar5 = std::__shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2> *)
                          local_240);
      this->current_expression_list = peVar5;
      bVar2 = parse_expression(this,(Template *)path_local,ExpressionClose);
      if (!bVar2) {
        Token::describe_abi_cxx11_(&local_2a8,&this->tok);
        ::std::operator+(&local_288,"expected expression close, got \'",&local_2a8);
        ::std::operator+(&local_268,&local_288,"\'");
        throw_parser_error(this,&local_268);
        ::std::__cxx11::string::~string((string *)&local_268);
        ::std::__cxx11::string::~string((string *)&local_288);
        ::std::__cxx11::string::~string((string *)&local_2a8);
      }
      std::shared_ptr<inja::ExpressionListNode>::~shared_ptr
                ((shared_ptr<inja::ExpressionListNode> *)local_240);
      break;
    default:
      Token::describe_abi_cxx11_(&local_368,&this->tok);
      ::std::operator+(&local_348,"unexpected token \'",&local_368);
      ::std::operator+(&local_328,&local_348,"\'");
      throw_parser_error(this,&local_328);
      ::std::__cxx11::string::~string((string *)&local_328);
      ::std::__cxx11::string::~string((string *)&local_348);
      ::std::__cxx11::string::~string((string *)&local_368);
      break;
    case LineStatementOpen:
      get_next_token(this);
      bVar2 = parse_statement(this,(Template *)path_local,LineStatementClose,local_20);
      if (!bVar2) {
        Token::describe_abi_cxx11_(&local_1d0,&this->tok);
        ::std::operator+(&local_1b0,"expected statement, got \'",&local_1d0);
        ::std::operator+(&local_190,&local_1b0,"\'");
        throw_parser_error(this,&local_190);
        ::std::__cxx11::string::~string((string *)&local_190);
        ::std::__cxx11::string::~string((string *)&local_1b0);
        ::std::__cxx11::string::~string((string *)&local_1d0);
      }
      if (((this->tok).kind != LineStatementClose) && ((this->tok).kind != Eof)) {
        __return_storage_ptr__ =
             &expression_list_node.
              super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        Token::describe_abi_cxx11_((string *)__return_storage_ptr__,&this->tok);
        ::std::operator+(&local_210,"expected line statement close, got \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__);
        ::std::operator+(&local_1f0,&local_210,"\'");
        throw_parser_error(this,&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_210);
        ::std::__cxx11::string::~string
                  ((string *)
                   &expression_list_node.
                    super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      break;
    case StatementOpen:
      get_next_token(this);
      bVar2 = parse_statement(this,(Template *)path_local,StatementClose,local_20);
      if (!bVar2) {
        Token::describe_abi_cxx11_(&local_110,&this->tok);
        ::std::operator+(&local_f0,"expected statement, got \'",&local_110);
        ::std::operator+(&local_d0,&local_f0,"\'");
        throw_parser_error(this,&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_f0);
        ::std::__cxx11::string::~string((string *)&local_110);
      }
      if ((this->tok).kind != StatementClose) {
        Token::describe_abi_cxx11_(&local_170,&this->tok);
        ::std::operator+(&local_150,"expected statement close, got \'",&local_170);
        ::std::operator+(&local_130,&local_150,"\'");
        throw_parser_error(this,&local_130);
        ::std::__cxx11::string::~string((string *)&local_130);
        ::std::__cxx11::string::~string((string *)&local_150);
        ::std::__cxx11::string::~string((string *)&local_170);
      }
      break;
    case CommentOpen:
      get_next_token(this);
      if ((this->tok).kind != CommentClose) {
        Token::describe_abi_cxx11_(&local_308,&this->tok);
        ::std::operator+(&local_2e8,"expected comment close, got \'",&local_308);
        ::std::operator+(&local_2c8,&local_2e8,"\'");
        throw_parser_error(this,&local_2c8);
        ::std::__cxx11::string::~string((string *)&local_2c8);
        ::std::__cxx11::string::~string((string *)&local_2e8);
        ::std::__cxx11::string::~string((string *)&local_308);
      }
      break;
    case Eof:
      bVar2 = std::
              stack<inja::IfStatementNode_*,_std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>_>
              ::empty(&this->if_statement_stack);
      if (!bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"unmatched if",&local_51);
        throw_parser_error(this,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::allocator<char>::~allocator(&local_51);
      }
      bVar2 = std::
              stack<inja::ForStatementNode_*,_std::deque<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>_>
              ::empty(&this->for_statement_stack);
      if (!bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"unmatched for",&local_89);
        throw_parser_error(this,&local_88);
        ::std::__cxx11::string::~string((string *)&local_88);
        ::std::allocator<char>::~allocator(&local_89);
      }
      this->current_block = (BlockNode *)0x0;
      return;
    }
  } while( true );
}

Assistant:

void parse_into(Template& tmpl, const std::filesystem::path& path) {
    lexer.start(tmpl.content);
    current_block = &tmpl.root;

    for (;;) {
      get_next_token();
      switch (tok.kind) {
      case Token::Kind::Eof: {
        if (!if_statement_stack.empty()) {
          throw_parser_error("unmatched if");
        }
        if (!for_statement_stack.empty()) {
          throw_parser_error("unmatched for");
        }
      }
        current_block = nullptr;
        return;
      case Token::Kind::Text: {
        current_block->nodes.emplace_back(std::make_shared<TextNode>(tok.text.data() - tmpl.content.c_str(), tok.text.size()));
      } break;
      case Token::Kind::StatementOpen: {
        get_next_token();
        if (!parse_statement(tmpl, Token::Kind::StatementClose, path)) {
          throw_parser_error("expected statement, got '" + tok.describe() + "'");
        }
        if (tok.kind != Token::Kind::StatementClose) {
          throw_parser_error("expected statement close, got '" + tok.describe() + "'");
        }
      } break;
      case Token::Kind::LineStatementOpen: {
        get_next_token();
        if (!parse_statement(tmpl, Token::Kind::LineStatementClose, path)) {
          throw_parser_error("expected statement, got '" + tok.describe() + "'");
        }
        if (tok.kind != Token::Kind::LineStatementClose && tok.kind != Token::Kind::Eof) {
          throw_parser_error("expected line statement close, got '" + tok.describe() + "'");
        }
      } break;
      case Token::Kind::ExpressionOpen: {
        get_next_token();

        auto expression_list_node = std::make_shared<ExpressionListNode>(tok.text.data() - tmpl.content.c_str());
        current_block->nodes.emplace_back(expression_list_node);
        current_expression_list = expression_list_node.get();

        if (!parse_expression(tmpl, Token::Kind::ExpressionClose)) {
          throw_parser_error("expected expression close, got '" + tok.describe() + "'");
        }
      } break;
      case Token::Kind::CommentOpen: {
        get_next_token();
        if (tok.kind != Token::Kind::CommentClose) {
          throw_parser_error("expected comment close, got '" + tok.describe() + "'");
        }
      } break;
      default: {
        throw_parser_error("unexpected token '" + tok.describe() + "'");
      } break;
      }
    }
    current_block = nullptr;
  }